

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void update_bitmap_after_coalescing(gen_ctx_t gen_ctx,bitmap_t bm)

{
  int iVar1;
  MIR_reg_t MVar2;
  ulong ix;
  uint uVar3;
  size_t nel;
  bitmap_iterator_t bi;
  ulong local_48;
  bitmap_iterator_t local_40;
  
  local_40.nbit = 0;
  local_40.bitmap = bm;
  while( true ) {
    iVar1 = bitmap_iterator_next(&local_40,&local_48);
    if (iVar1 == 0) break;
    uVar3 = (uint)local_48;
    if (0x21 < uVar3) {
      ix = local_48 & 0xffffffff;
      MVar2 = VARR_MIR_reg_tget(gen_ctx->coalesce_ctx->first_coalesced_reg,ix);
      if (MVar2 != uVar3) {
        bitmap_clear_bit_p(bm,ix);
        bitmap_set_bit_p(bm,(ulong)MVar2);
      }
    }
  }
  return;
}

Assistant:

static void update_bitmap_after_coalescing (gen_ctx_t gen_ctx, bitmap_t bm) {
  MIR_reg_t reg, first_reg;
  size_t nel;
  bitmap_iterator_t bi;

  FOREACH_BITMAP_BIT (bi, bm, nel) {
    reg = (MIR_reg_t) nel;
    if (reg <= MAX_HARD_REG) continue;
    if ((first_reg = VARR_GET (MIR_reg_t, first_coalesced_reg, reg)) == reg) continue;
    bitmap_clear_bit_p (bm, reg);
    bitmap_set_bit_p (bm, first_reg);
  }
}